

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::LessEqual(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ulong uVar5;
  double dVar6;
  
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ac16ee;
    *puVar4 = 0;
  }
  uVar5 = (ulong)aRight & 0xffff000000000000;
  bVar2 = ((ulong)aRight & 0x1ffff00000000) != 0x1000000000000;
  if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    if (bVar2 && uVar5 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00ac16ee:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (uVar5 == 0x1000000000000) {
      bVar2 = (int)aLeft <= (int)aRight;
      goto LAB_00ac16dc;
    }
    if ((ulong)aRight >> 0x32 == 0) goto LAB_00ac16c0;
    dVar6 = (double)(int)aLeft;
LAB_00ac16af:
    bVar2 = (double)((ulong)aRight ^ 0xfffc000000000000) < dVar6;
  }
  else {
    if (bVar2 && uVar5 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00ac16ee;
      *puVar4 = 0;
    }
    if (uVar5 != 0x1000000000000) {
      if (aRight < (Var)0x4000000000000 || aLeft < (Var)0x4000000000000) goto LAB_00ac16c0;
      dVar6 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      goto LAB_00ac16af;
    }
    if (aLeft < (Var)0x4000000000000) {
LAB_00ac16c0:
      BVar3 = RelationalComparisonHelper(aRight,aLeft,scriptContext,false,true);
      bVar2 = BVar3 == 0;
      goto LAB_00ac16dc;
    }
    bVar2 = (double)(int)aRight < (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  bVar2 = !bVar2;
LAB_00ac16dc:
  return (BOOL)bVar2;
}

Assistant:

BOOL JavascriptOperators::LessEqual(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_LessEqual);
        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // Works whether it is TaggedInt31 or TaggedInt32
                return ::Math::PointerCastToIntegralTruncate<int>(aLeft) <= ::Math::PointerCastToIntegralTruncate<int>(aRight);
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }
        else if (TaggedInt::Is(aRight))
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
            {
                return JavascriptNumber::GetValue(aLeft) <= TaggedInt::ToDouble(aRight);
            }
        }
        else
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }

        return !RelationalComparisonHelper(aRight, aLeft, scriptContext, false, true);
        JIT_HELPER_END(Op_LessEqual);
    }